

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O1

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  long *plVar1;
  VectorOfPairs *__range1;
  vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>
  *this_00;
  long *plVar2;
  shared_ptr<cmVariableWatch::Pair> p;
  shared_ptr<cmVariableWatch::Pair> local_40;
  
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005d2988;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_use_count = 0;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_weak_count = 0;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)method;
  *(void **)&local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi[1]._M_use_count = client_data;
  local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._vptr__Sp_counted_base = (_func_int **)delete_data;
  this_00 = (vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
               ::operator[](&this->WatchMap,variable);
  plVar1 = *(long **)(this_00 + 8);
  for (plVar2 = *(long **)this_00; plVar2 != plVar1; plVar2 = plVar2 + 2) {
    if (((client_data != (void *)0x0) && (*(WatchMethod *)*plVar2 == method)) &&
       ((void *)((long *)*plVar2)[1] == client_data)) goto LAB_00209922;
  }
  std::
  vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>
  ::emplace_back<std::shared_ptr<cmVariableWatch::Pair>>(this_00,&local_40);
LAB_00209922:
  if (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return plVar2 == plVar1;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  auto p = std::make_shared<cmVariableWatch::Pair>();
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs& vp = this->WatchMap[variable];
  for (auto& pair : vp) {
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp.push_back(std::move(p));
  return true;
}